

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O1

apx_error_t apx_dataElement_set_name_cstr(apx_dataElement_t *self,char *name)

{
  char *pcVar1;
  
  if (self != (apx_dataElement_t *)0x0) {
    pcVar1 = strdup(name);
    self->name = pcVar1;
    return (uint)(pcVar1 == (char *)0x0) * 2;
  }
  return 1;
}

Assistant:

apx_error_t apx_dataElement_set_name_cstr(apx_dataElement_t* self, const char* name)
{
   if (self != NULL)
   {
      self->name = STRDUP(name);
      if (self->name == NULL)
      {
         return APX_MEM_ERROR;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}